

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_timeout.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::enable_hb_for_peer(raft_server *this,peer *p)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  id in_RSI;
  long in_RDI;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  ptr<delayed_task> *in_stack_ffffffffffffffa8;
  raft_server *in_stack_ffffffffffffffb0;
  thread local_10;
  
  local_10._M_id._M_thread = (id)(id)in_RSI._M_thread;
  peer::enable_hb((peer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0));
  peer::resume_hb_speed((peer *)0x308141);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar1) {
    peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x30816c);
    iVar2 = (*peVar4->_vptr_logger[7])();
    if (5 < iVar2) {
      in_stack_ffffffffffffffa8 =
           (ptr<delayed_task> *)
           std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x30818f);
      in_stack_ffffffffffffffa4 = peer::get_id((peer *)0x30819e);
      uVar3 = peer::get_current_hb_interval((peer *)0x3081ac);
      in_stack_ffffffffffffffb0 = (raft_server *)&stack0xffffffffffffffd0;
      msg_if_given_abi_cxx11_
                ((char *)in_stack_ffffffffffffffb0,"peer %d, interval: %d\n",
                 (ulong)in_stack_ffffffffffffffa4,(ulong)uVar3);
      (*(code *)(in_stack_ffffffffffffffa8->
                super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                _vptr_delayed_task)
                (in_stack_ffffffffffffffa8,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                 ,"enable_hb_for_peer",0x25,in_stack_ffffffffffffffb0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    }
  }
  peer::get_hb_task((peer *)local_10._M_id._M_thread);
  peer::get_current_hb_interval((peer *)0x308236);
  schedule_task(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  return;
}

Assistant:

void raft_server::enable_hb_for_peer(peer& p) {
    p.enable_hb(true);
    p.resume_hb_speed();
    p_tr("peer %d, interval: %d\n", p.get_id(), p.get_current_hb_interval());
    schedule_task(p.get_hb_task(), p.get_current_hb_interval());
}